

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

size_t ON_FixedSizePool::DefaultElementCapacityFromSizeOfElement(size_t sizeof_element)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (sizeof_element == 0) {
    uVar2 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,100,"","sizeof_element must be > 0");
  }
  else {
    sVar1 = ON_MemoryPageSize();
    sVar3 = 0x200;
    if (0x200 < sVar1) {
      sVar3 = sVar1;
    }
    uVar2 = (sVar3 - 0x30) / sizeof_element;
    if (uVar2 < 1000) {
      uVar4 = 1;
      do {
        uVar4 = uVar4 * 2;
        uVar2 = (uVar4 * sVar3 - 0x30) / sizeof_element;
        if (999 < uVar2) {
          return uVar2;
        }
      } while (uVar4 < 9 || uVar2 < 0x41);
    }
  }
  return uVar2;
}

Assistant:

size_t ON_FixedSizePool::DefaultElementCapacityFromSizeOfElement(size_t sizeof_element)
{
  size_t block_element_capacity = 0;
  if (sizeof_element <= 0)
  {
    ON_ERROR("sizeof_element must be > 0");
    return 0;
  }

  size_t page_size = ON_MemoryPageSize();
  if (page_size < 512)
    page_size = 512;

  // The "overhead" is for the 2*sizeof(void*) ON_FixedSizePool uses at
  // the start of each block + 32 bytes extra for the heap manager
  // to keep the total allocation not exceeding multiple of page_size.
  const size_t overhead = 2 * sizeof(void*) + 32;

  size_t page_count = 1;
  block_element_capacity = (page_count * page_size - overhead) / sizeof_element;
  while (block_element_capacity < 1000)
  {
    page_count *= 2;
    block_element_capacity = (page_count * page_size - overhead) / sizeof_element;
    if (page_count > 8 && block_element_capacity > 64)
    {
      // for pools with large elements
      break;
    }
  }

  return block_element_capacity;
}